

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O1

void __thiscall OpenMD::Velocitizer::removeAngularDrift(Velocitizer *this)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  uint i;
  Molecule *pMVar7;
  uint j;
  long lVar8;
  pointer ppSVar9;
  StuntDouble *pSVar10;
  uint i_1;
  long lVar11;
  double (*inertiaTensor_00) [3];
  Vector<double,_3U> result;
  MoleculeIterator mi;
  Vector<double,_3U> result_4;
  Vector3<double> result_3;
  Vector3d angularMomentum;
  Vector3d com;
  Vector3d vdrift;
  Mat3x3d inertiaTensor;
  double local_1b8 [4];
  SquareMatrix3<double> local_198;
  MoleculeIterator local_150;
  double local_148 [4];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  uint uStack_104;
  undefined4 uStack_100;
  uint uStack_fc;
  undefined4 local_f8;
  uint uStack_f4;
  undefined4 uStack_f0;
  uint uStack_ec;
  double local_e8 [4];
  Vector3d local_c8;
  Vector3d local_a8;
  Vector3d local_88;
  double local_68 [9];
  
  local_88.super_Vector<double,_3U>.data_[0] = 0.0;
  local_88.super_Vector<double,_3U>.data_[1] = 0.0;
  lVar11 = 0;
  local_88.super_Vector<double,_3U>.data_[2] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
  Thermo::getComAll(&this->thermo_,&local_a8,&local_88);
  inertiaTensor_00 = (double (*) [3])local_68;
  local_68[8] = 0.0;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
  Thermo::getInertiaTensor(&this->thermo_,(Mat3x3d *)inertiaTensor_00,&local_c8);
  SquareMatrix3<double>::inverse(&local_198,(SquareMatrix3<double> *)inertiaTensor_00);
  do {
    *(undefined8 *)((long)local_68 + lVar11 + 0x10) =
         *(undefined8 *)
          ((long)local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar11 + 0x10);
    uVar4 = *(undefined8 *)
             ((long)local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0] + lVar11 + 8);
    *(undefined8 *)((long)local_68 + lVar11) =
         *(undefined8 *)
          ((long)local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar11);
    *(undefined8 *)((long)local_68 + lVar11 + 8) = uVar4;
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x48);
  local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  lVar11 = 0;
  do {
    dVar2 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            [lVar11];
    lVar8 = 0;
    do {
      dVar2 = dVar2 + (((SquareMatrix<double,_3> *)*inertiaTensor_00)->
                      super_RectMatrix<double,_3U,_3U>).data_[0][lVar8] *
                      local_c8.super_Vector<double,_3U>.data_[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar11] =
         dVar2;
    lVar11 = lVar11 + 1;
    inertiaTensor_00 = inertiaTensor_00 + 1;
  } while (lVar11 != 3);
  local_118 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  uStack_110 = 0;
  local_128 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  uStack_120 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  local_150._M_node = (_Base_ptr)0x0;
  pMVar7 = SimInfo::beginMolecule(this->info_,&local_150);
  if (pMVar7 != (Molecule *)0x0) {
    local_f8 = (undefined4)uStack_120;
    uStack_f4 = uStack_120._4_4_ ^ 0x80000000;
    uStack_f0 = (undefined4)local_118;
    uStack_ec = local_118._4_4_ ^ 0x80000000;
    local_108 = (undefined4)local_128;
    uStack_104 = local_128._4_4_ ^ 0x80000000;
    uStack_100 = (undefined4)uStack_120;
    uStack_fc = uStack_120._4_4_ ^ 0x80000000;
    do {
      ppSVar9 = (pMVar7->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (ppSVar9 ==
            (pMVar7->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar10 = (StuntDouble *)0x0;
        }
        else {
          pSVar10 = *ppSVar9;
        }
        if (pSVar10 == (StuntDouble *)0x0) break;
        lVar11 = *(long *)((long)&(pSVar10->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar10->storage_);
        local_1b8[2] = (double)*(undefined8 *)(lVar11 + 0x10 + (long)pSVar10->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar11 + (long)pSVar10->localIndex_ * 0x18);
        local_1b8[0] = *pdVar1;
        local_1b8[1] = pdVar1[1];
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
        lVar11 = 0;
        do {
          local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar11]
               = local_1b8[lVar11] - local_a8.super_Vector<double,_3U>.data_[lVar11];
          dVar6 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [2];
          dVar5 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [1];
          dVar2 = local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar11 = *(long *)((long)&(pSVar10->snapshotMan_->currentSnapshot_->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar10->storage_);
        local_1b8[2] = (double)*(undefined8 *)(lVar11 + 0x10 + (long)pSVar10->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar11 + (long)pSVar10->localIndex_ * 0x18);
        local_1b8[0] = *pdVar1;
        local_1b8[1] = pdVar1[1];
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
        local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
        lVar11 = 0;
        do {
          local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar11]
               = local_1b8[lVar11] - local_88.super_Vector<double,_3U>.data_[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        local_e8[0] = dVar6 * local_128 + dVar5 * (double)CONCAT44(uStack_f4,local_f8);
        local_e8[1] = dVar2 * uStack_120 + dVar6 * (double)CONCAT44(uStack_ec,uStack_f0);
        local_e8[2] = dVar2 * (double)CONCAT44(uStack_104,local_108) + local_118 * dVar5;
        local_148[0] = 0.0;
        local_148[1] = 0.0;
        local_148[2] = 0.0;
        lVar11 = 0;
        do {
          local_148[lVar11] =
               local_198.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
               [lVar11] - local_e8[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        iVar3 = pSVar10->localIndex_;
        lVar11 = *(long *)((long)&(pSVar10->snapshotMan_->currentSnapshot_->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar10->storage_);
        *(double *)(lVar11 + 0x10 + (long)iVar3 * 0x18) = local_148[2];
        pdVar1 = (double *)(lVar11 + (long)iVar3 * 0x18);
        *pdVar1 = local_148[0];
        pdVar1[1] = local_148[1];
        ppSVar9 = ppSVar9 + 1;
      }
      pMVar7 = SimInfo::nextMolecule(this->info_,&local_150);
    } while (pMVar7 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void Velocitizer::removeAngularDrift() {
    // Get the Center of Mass drift velocity.

    Vector3d vdrift;
    Vector3d com;

    thermo_.getComAll(com, vdrift);

    Mat3x3d inertiaTensor;
    Vector3d angularMomentum;
    Vector3d omega;

    thermo_.getInertiaTensor(inertiaTensor, angularMomentum);

    // We now need the inverse of the inertia tensor.
    inertiaTensor = inertiaTensor.inverse();
    omega         = inertiaTensor * angularMomentum;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d tempComPos;

    // Corrects for the center of mass angular drift by summing all
    // the angular momentum and dividing by the total mass.

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        tempComPos = sd->getPos() - com;
        sd->setVel((sd->getVel() - vdrift) - cross(omega, tempComPos));
      }
    }
  }